

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O2

vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> * __thiscall
glu::sl::ShaderParser::parse
          (vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *__return_storage_ptr__,
          ShaderParser *this)

{
  Token TVar1;
  Resource *pRVar2;
  uint uVar3;
  undefined8 extraout_RAX;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  uVar3 = (*((this->m_resource).super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.
             m_data.ptr)->_vptr_Resource[3])();
  std::vector<char,_std::allocator<char>_>::resize(&this->m_input,(long)(int)(uVar3 + 1));
  pRVar2 = (this->m_resource).super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.
           m_data.ptr;
  (*pRVar2->_vptr_Resource[5])(pRVar2,0);
  pRVar2 = (this->m_resource).super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.
           m_data.ptr;
  (*pRVar2->_vptr_Resource[2])
            (pRVar2,(this->m_input).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,(ulong)uVar3);
  (this->m_input).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start[(int)uVar3] = '\0';
  this->m_curPtr =
       (this->m_input).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_start;
  this->m_curToken = TOKEN_INVALID;
  std::__cxx11::string::assign((char *)&this->m_curTokenStr);
  advanceToken(this);
  (__return_storage_ptr__->super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    while( true ) {
      while (TVar1 = this->m_curToken, TVar1 == TOKEN_GROUP) {
        parseShaderGroup(this,__return_storage_ptr__);
      }
      if (TVar1 != TOKEN_CASE) break;
      parseShaderCase(this,__return_storage_ptr__);
    }
    if (TVar1 != TOKEN_IMPORT) break;
    parseImport(this,__return_storage_ptr__);
  }
  if (TVar1 == TOKEN_EOF) {
    assumeToken(this,TOKEN_EOF);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"invalid token encountered at main level: \'",&local_79);
  std::operator+(&local_58,&local_78,&this->m_curTokenStr);
  std::operator+(&local_38,&local_58,"\'");
  parseError(this,&local_38);
  std::_Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~_Vector_base
            (&__return_storage_ptr__->
              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

vector<tcu::TestNode*> ShaderParser::parse (void)
{
	const int	dataLen		= m_resource->getSize();

	m_input.resize(dataLen+1);
	m_resource->setPosition(0);
	m_resource->read((deUint8*)&m_input[0], dataLen);
	m_input[dataLen] = '\0';

	// Initialize parser.
	m_curPtr		= &m_input[0];
	m_curToken		= TOKEN_INVALID;
	m_curTokenStr	= "";
	advanceToken();

	vector<tcu::TestNode*> nodeList;

	// Parse all cases.
	PARSE_DBG(("parse()\n"));
	for (;;)
	{
		if (m_curToken == TOKEN_CASE)
			parseShaderCase(nodeList);
		else if (m_curToken == TOKEN_GROUP)
			parseShaderGroup(nodeList);
		else if (m_curToken == TOKEN_IMPORT)
			parseImport(nodeList);
		else if (m_curToken == TOKEN_EOF)
			break;
		else
			parseError(string("invalid token encountered at main level: '") + m_curTokenStr + "'");
	}

	assumeToken(TOKEN_EOF);
//	printf("  parsed %d test cases.\n", caseList.size());
	return nodeList;
}